

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImDrawVert *pIVar3;
  ImVec4 *pIVar4;
  float *pfVar5;
  ImDrawIdx IVar6;
  ImDrawIdx IVar7;
  uint uVar8;
  int iVar9;
  ImDrawIdx IVar10;
  ulong uVar11;
  ulong uVar12;
  ImDrawIdx IVar13;
  uint uVar14;
  byte bVar15;
  ImDrawIdx *pIVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ImDrawIdx IVar21;
  int iVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float afStack_88 [4];
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ulong local_58;
  ulong local_50;
  ImDrawIdx **local_48;
  ulong local_40;
  float local_34;
  
  if (1 < points_count) {
    local_60 = (ImVec2)(ulong)(points_count - 1U);
    IVar2 = this->_Data->TexUvWhitePixel;
    uVar8 = points_count;
    if ((flags & 1U) == 0) {
      uVar8 = points_count - 1U;
    }
    local_78.y = 0.0;
    local_78.x = (float)uVar8;
    local_48 = (ImDrawIdx **)CONCAT44(local_48._4_4_,thickness);
    if ((this->Flags & 1U) == 0) {
      afStack_88[2] = 2.006147e-39;
      afStack_88[3] = 0.0;
      PrimReserve(this,uVar8 * 6,uVar8 * 4);
      if (0 < (int)local_78.x) {
        uVar19 = 1;
        do {
          uVar12 = uVar19;
          if ((uint)points_count == uVar19) {
            uVar12 = 0;
          }
          fVar28 = points[uVar19 - 1].y;
          fVar24 = points[uVar12].x - points[uVar19 - 1].x;
          fVar27 = points[uVar12].y - fVar28;
          fVar31 = fVar24 * fVar24 + fVar27 * fVar27;
          if (0.0 < fVar31) {
            auVar33 = rsqrtss(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
            fVar24 = fVar24 * auVar33._0_4_;
            fVar27 = fVar27 * auVar33._0_4_;
          }
          fVar24 = fVar24 * local_48._0_4_ * 0.5;
          fVar27 = fVar27 * local_48._0_4_ * 0.5;
          pIVar3 = this->_VtxWritePtr;
          (pIVar3->pos).x = points[uVar19 - 1].x + fVar27;
          (pIVar3->pos).y = fVar28 - fVar24;
          pIVar3->uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3->col = col;
          pIVar3[1].pos.x = points[uVar12].x + fVar27;
          pIVar3[1].pos.y = points[uVar12].y - fVar24;
          pIVar3[1].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[1].col = col;
          pIVar3[2].pos.x = points[uVar12].x - fVar27;
          pIVar3[2].pos.y = points[uVar12].y + fVar24;
          pIVar3[2].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[2].col = col;
          pIVar3[3].pos.x = points[uVar19 - 1].x - fVar27;
          pIVar3[3].pos.y = fVar24 + points[uVar19 - 1].y;
          pIVar3[3].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[3].col = col;
          this->_VtxWritePtr = pIVar3 + 4;
          uVar8 = this->_VtxCurrentIdx;
          pIVar16 = this->_IdxWritePtr;
          IVar10 = (ImDrawIdx)uVar8;
          *pIVar16 = IVar10;
          pIVar16[1] = IVar10 + 1;
          pIVar16[2] = IVar10 + 2;
          pIVar16[3] = IVar10;
          pIVar16[4] = IVar10 + 2;
          pIVar16[5] = IVar10 + 3;
          this->_IdxWritePtr = pIVar16 + 6;
          this->_VtxCurrentIdx = uVar8 + 4;
          bVar23 = uVar19 != ((ulong)local_78 & 0xffffffff);
          uVar19 = uVar19 + 1;
        } while (bVar23);
      }
    }
    else {
      local_68.x = thickness;
      if (thickness <= 1.0) {
        local_68.x = 1.0;
      }
      local_68.y = (float)(int)local_68.x;
      local_34 = this->_FringeScale;
      bVar15 = local_34 == 1.0 & (int)local_68.y < 0x3f & (byte)this->Flags >> 1 &
               local_68.x - (float)(int)local_68.y <= 1e-05;
      iVar22 = 0x12;
      if (thickness <= local_34) {
        iVar22 = 0xc;
      }
      iVar9 = 6;
      if (bVar15 == 0) {
        iVar9 = iVar22;
      }
      local_40 = CONCAT71(local_40._1_7_,bVar15);
      local_50 = CONCAT44(local_50._4_4_,flags);
      if (bVar15 == 1) {
        IStack_70.y = (float)(points_count * 2);
        iVar22 = 3;
      }
      else {
        IStack_70.y = (float)(points_count * 3);
        if (local_34 < thickness) {
          IStack_70.y = (float)(points_count * 4);
        }
        iVar22 = (uint)(local_34 < thickness) * 2 + 3;
      }
      afStack_88[2] = 2.006976e-39;
      afStack_88[3] = 0.0;
      local_58 = (ulong)(uint)points_count;
      PrimReserve(this,iVar9 * uVar8,(int)IStack_70.y);
      uVar8 = (uint)local_58;
      lVar18 = -((ulong)(iVar22 * uVar8) * 8 + 0xf & 0xfffffffffffffff0);
      pfVar5 = (float *)((long)&local_78 + lVar18);
      uVar19 = local_58 & 0xffffffff;
      fVar28 = local_78.x;
      bVar15 = (byte)local_40;
      if (0 < (int)fVar28) {
        uVar12 = 1;
        do {
          uVar11 = uVar12;
          if (uVar19 == uVar12) {
            uVar11 = 0;
          }
          fVar24 = points[uVar11].x - points[uVar12 - 1].x;
          fVar27 = points[uVar11].y - points[uVar12 - 1].y;
          fVar31 = fVar24 * fVar24 + fVar27 * fVar27;
          if (0.0 < fVar31) {
            auVar33 = rsqrtss(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
            fVar24 = fVar24 * auVar33._0_4_;
            fVar27 = fVar27 * auVar33._0_4_;
          }
          *(float *)((long)afStack_88 + uVar12 * 8 + lVar18 + 8) = fVar27;
          *(float *)((long)afStack_88 + uVar12 * 8 + lVar18 + 0xc) = -fVar24;
          bVar23 = uVar12 != ((ulong)local_78 & 0xffffffff);
          uVar12 = uVar12 + 1;
        } while (bVar23);
      }
      pfVar1 = pfVar5 + uVar19 * 2;
      if ((local_50 & 1) == 0) {
        *(undefined8 *)(pfVar5 + ((ulong)local_60 & 0xffffffff) * 2) = *(undefined8 *)(pfVar1 + -4);
      }
      uVar14 = col & 0xffffff;
      if ((local_48._0_4_ <= local_34 | bVar15) == 1) {
        fVar24 = local_34;
        if (bVar15 != 0) {
          fVar24 = local_68.x * 0.5 + 1.0;
        }
        local_34 = (float)uVar14;
        if ((local_50 & 1) == 0) {
          fVar27 = *pfVar5;
          fVar25 = *(float *)((long)&local_78 + lVar18 + 4) * fVar24;
          fVar31 = points->x;
          fVar32 = points->y;
          *(ulong *)pfVar1 = CONCAT44(fVar25 + fVar32,fVar27 * fVar24 + fVar31);
          *(ulong *)(pfVar1 + 2) = CONCAT44(fVar32 - fVar25,fVar31 - fVar27 * fVar24);
          uVar11 = (ulong)local_60 & 0xffffffff;
          fVar27 = points[uVar11].x;
          fVar31 = points[uVar11].y;
          uVar12 = (ulong)(uint)((int)local_60.x * 2);
          *(ulong *)(pfVar1 + uVar12 * 2) =
               CONCAT44(*(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar24 + fVar31,
                        pfVar5[uVar11 * 2] * fVar24 + fVar27);
          *(ulong *)(pfVar1 + uVar12 * 2 + 2) =
               CONCAT44(fVar31 - *(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar24,
                        fVar27 - pfVar5[uVar11 * 2] * fVar24);
        }
        if (0 < (int)fVar28) {
          local_50 = (ulong)((byte)local_40 ^ 3);
          local_48 = &this->_IdxWritePtr;
          pIVar16 = this->_IdxWritePtr;
          uVar12 = 1;
          uVar8 = this->_VtxCurrentIdx;
          do {
            uVar11 = uVar12 & 0xffffffff;
            if (uVar19 == uVar12) {
              uVar11 = 0;
            }
            uVar14 = uVar8 + (int)local_50;
            if (uVar19 == uVar12) {
              uVar14 = this->_VtxCurrentIdx;
            }
            fVar28 = (*(float *)((long)afStack_88 + uVar12 * 8 + lVar18 + 8) + pfVar5[uVar11 * 2]) *
                     0.5;
            fVar27 = (*(float *)((long)afStack_88 + uVar12 * 8 + lVar18 + 0xc) +
                     *(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4)) * 0.5;
            fVar31 = fVar28 * fVar28 + fVar27 * fVar27;
            if (1e-06 < fVar31) {
              fVar31 = 1.0 / fVar31;
              fVar32 = 100.0;
              if (fVar31 <= 100.0) {
                fVar32 = fVar31;
              }
              fVar28 = fVar28 * fVar32;
              fVar27 = fVar27 * fVar32;
            }
            uVar17 = (ulong)(uint)((int)uVar11 * 2);
            fVar31 = points[uVar11].x;
            pfVar1[uVar17 * 2] = fVar31 + fVar28 * fVar24;
            fVar32 = points[uVar11].y;
            pfVar1[uVar17 * 2 + 1] = fVar27 * fVar24 + fVar32;
            pfVar1[uVar17 * 2 + 2] = fVar31 - fVar28 * fVar24;
            pfVar1[uVar17 * 2 + 3] = fVar32 - fVar27 * fVar24;
            IVar10 = (ImDrawIdx)uVar14;
            *pIVar16 = IVar10;
            IVar21 = (ImDrawIdx)uVar8;
            pIVar16[1] = IVar21;
            if ((byte)local_40 == 0) {
              pIVar16[2] = IVar21 + 2;
              pIVar16[3] = IVar21 + 2;
              pIVar16[4] = IVar10 + 2;
              pIVar16[5] = IVar10;
              pIVar16[6] = IVar10 + 1;
              pIVar16[7] = IVar21 + 1;
              pIVar16[8] = IVar21;
              pIVar16[9] = IVar21;
              pIVar16[10] = IVar10;
              pIVar16[0xb] = IVar10 + 1;
              lVar20 = 0x18;
            }
            else {
              pIVar16[2] = IVar21 + 1;
              pIVar16[3] = IVar10 + 1;
              pIVar16[4] = IVar21 + 1;
              pIVar16[5] = IVar10;
              lVar20 = 0xc;
            }
            pIVar16 = (ImDrawIdx *)((long)pIVar16 + lVar20);
            *local_48 = pIVar16;
            bVar23 = uVar12 != ((ulong)local_78 & 0xffffffff);
            uVar12 = uVar12 + 1;
            uVar8 = uVar14;
          } while (bVar23);
        }
        if ((byte)local_40 == 0) {
          uVar12 = 1;
          if (1 < (int)local_58) {
            uVar12 = local_58 & 0xffffffff;
          }
          lVar18 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar18);
            this->_VtxWritePtr->uv = IVar2;
            pIVar3 = this->_VtxWritePtr;
            pIVar3->col = col;
            pIVar3[1].pos = *(ImVec2 *)((long)pfVar5 + lVar18 * 2 + uVar19 * 8);
            this->_VtxWritePtr[1].uv = IVar2;
            pIVar3 = this->_VtxWritePtr;
            pIVar3[1].col = (ImU32)local_34;
            pIVar3[2].pos = *(ImVec2 *)((long)pfVar5 + lVar18 * 2 + uVar19 * 8 + 8);
            this->_VtxWritePtr[2].uv = IVar2;
            pIVar3 = this->_VtxWritePtr;
            pIVar3[2].col = (ImU32)local_34;
            this->_VtxWritePtr = pIVar3 + 3;
            lVar18 = lVar18 + 8;
          } while (uVar12 * 8 != lVar18);
        }
        else {
          pIVar4 = this->_Data->TexUvLines;
          lVar18 = (long)(int)local_68.y;
          fVar28 = pIVar4[lVar18].x;
          fVar24 = pIVar4[lVar18].y;
          uVar12 = 1;
          if (1 < (int)local_58) {
            uVar12 = local_58 & 0xffffffff;
          }
          fVar27 = pIVar4[lVar18].z;
          fVar31 = pIVar4[lVar18].w;
          lVar18 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar5 + lVar18 + uVar19 * 8);
            pIVar3 = this->_VtxWritePtr;
            (pIVar3->uv).x = fVar28;
            (pIVar3->uv).y = fVar24;
            pIVar3 = this->_VtxWritePtr;
            pIVar3->col = col;
            pIVar3[1].pos = *(ImVec2 *)((long)pfVar5 + lVar18 + uVar19 * 8 + 8);
            pIVar3 = this->_VtxWritePtr;
            pIVar3[1].uv.x = fVar27;
            pIVar3[1].uv.y = fVar31;
            pIVar3 = this->_VtxWritePtr;
            pIVar3[1].col = col;
            this->_VtxWritePtr = pIVar3 + 2;
            lVar18 = lVar18 + 0x10;
          } while (uVar12 * 0x10 != lVar18);
        }
      }
      else {
        fVar27 = (local_68.x - local_34) * 0.5;
        fVar24 = local_34 + fVar27;
        if ((local_50 & 1) == 0) {
          fVar31 = *(float *)((long)&local_78 + lVar18 + 4);
          fVar29 = fVar24 * *pfVar5;
          fVar30 = fVar24 * fVar31;
          fVar32 = points->x;
          fVar25 = points->y;
          fVar26 = *pfVar5 * fVar27;
          fVar31 = fVar31 * fVar27;
          *pfVar1 = fVar29 + fVar32;
          pfVar1[1] = fVar30 + fVar25;
          pfVar1[2] = fVar26 + fVar32;
          pfVar1[3] = fVar31 + fVar25;
          pfVar1[4] = fVar32 - fVar26;
          pfVar1[5] = fVar25 - fVar31;
          pfVar1[6] = fVar32 - fVar29;
          pfVar1[7] = fVar25 - fVar30;
          uVar11 = (ulong)local_60 & 0xffffffff;
          fVar31 = points[uVar11].x;
          fVar32 = points[uVar11].y;
          uVar12 = (ulong)(uint)((int)local_60.x << 2);
          *(ulong *)(pfVar1 + uVar12 * 2) =
               CONCAT44(*(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar24 + fVar32,
                        pfVar5[uVar11 * 2] * fVar24 + fVar31);
          *(ulong *)(pfVar1 + uVar12 * 2 + 2) =
               CONCAT44(*(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar27 + fVar32,
                        pfVar5[uVar11 * 2] * fVar27 + fVar31);
          *(ulong *)(pfVar1 + uVar12 * 2 + 4) =
               CONCAT44(fVar32 - *(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar27,
                        fVar31 - pfVar5[uVar11 * 2] * fVar27);
          *(ulong *)(pfVar1 + uVar12 * 2 + 6) =
               CONCAT44(fVar32 - *(float *)((long)&local_78 + uVar11 * 8 + lVar18 + 4) * fVar24,
                        fVar31 - pfVar5[uVar11 * 2] * fVar24);
        }
        local_40 = uVar19;
        local_34 = (float)uVar14;
        if (0 < (int)fVar28) {
          pIVar16 = this->_IdxWritePtr;
          local_48 = (ImDrawIdx **)-((ulong)local_78 & 0xffffffff);
          uVar19 = 1;
          uVar8 = this->_VtxCurrentIdx;
          do {
            uVar12 = uVar19 & 0xffffffff;
            if (local_40 == uVar19) {
              uVar12 = 0;
            }
            uVar14 = uVar8 + 4;
            if (local_40 == uVar19) {
              uVar14 = this->_VtxCurrentIdx;
            }
            fVar31 = (*(float *)((long)afStack_88 + uVar19 * 8 + lVar18 + 8) + pfVar5[uVar12 * 2]) *
                     0.5;
            fVar28 = (*(float *)((long)afStack_88 + uVar19 * 8 + lVar18 + 0xc) +
                     *(float *)((long)&local_78 + uVar12 * 8 + lVar18 + 4)) * 0.5;
            fVar32 = fVar31 * fVar31 + fVar28 * fVar28;
            if (1e-06 < fVar32) {
              fVar32 = 1.0 / fVar32;
              fVar25 = 100.0;
              if (fVar32 <= 100.0) {
                fVar25 = fVar32;
              }
              fVar31 = fVar31 * fVar25;
              fVar28 = fVar28 * fVar25;
            }
            uVar11 = (ulong)(uint)((int)uVar12 * 4);
            fVar32 = points[uVar12].x;
            pfVar1[uVar11 * 2] = fVar24 * fVar31 + fVar32;
            fVar25 = points[uVar12].y;
            pfVar1[uVar11 * 2 + 1] = fVar24 * fVar28 + fVar25;
            pfVar1[uVar11 * 2 + 2] = fVar31 * fVar27 + fVar32;
            pfVar1[uVar11 * 2 + 3] = fVar28 * fVar27 + fVar25;
            pfVar1[uVar11 * 2 + 4] = fVar32 - fVar31 * fVar27;
            pfVar1[uVar11 * 2 + 5] = fVar25 - fVar28 * fVar27;
            pfVar1[uVar11 * 2 + 6] = fVar32 - fVar24 * fVar31;
            pfVar1[uVar11 * 2 + 7] = fVar25 - fVar24 * fVar28;
            IVar10 = (ImDrawIdx)uVar14;
            IVar13 = IVar10 + 1;
            *pIVar16 = IVar13;
            IVar21 = (ImDrawIdx)uVar8;
            pIVar16[1] = IVar21 + 1;
            IVar6 = IVar21 + 2;
            pIVar16[2] = IVar6;
            pIVar16[3] = IVar6;
            IVar7 = IVar10 + 2;
            pIVar16[4] = IVar7;
            pIVar16[5] = IVar13;
            pIVar16[6] = IVar13;
            pIVar16[7] = IVar21 + 1;
            pIVar16[8] = IVar21;
            pIVar16[9] = IVar21;
            pIVar16[10] = IVar10;
            pIVar16[0xb] = IVar13;
            pIVar16[0xc] = IVar7;
            pIVar16[0xd] = IVar6;
            pIVar16[0xe] = IVar21 + 3;
            pIVar16[0xf] = IVar21 + 3;
            pIVar16[0x10] = IVar10 + 3;
            pIVar16[0x11] = IVar7;
            pIVar16 = pIVar16 + 0x12;
            lVar20 = (long)local_48 + uVar19;
            uVar19 = uVar19 + 1;
            uVar8 = uVar14;
          } while (lVar20 != 0);
          this->_IdxWritePtr = pIVar16;
          uVar8 = (uint)local_58;
        }
        uVar19 = 1;
        if (1 < (int)uVar8) {
          uVar19 = (ulong)uVar8;
        }
        lVar18 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)pfVar5 + lVar18 + local_40 * 8);
          this->_VtxWritePtr->uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3->col = (ImU32)local_34;
          pIVar3[1].pos = *(ImVec2 *)((long)pfVar5 + lVar18 + local_40 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[1].col = col;
          pIVar3[2].pos = *(ImVec2 *)((long)pfVar5 + lVar18 + local_40 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[2].col = col;
          pIVar3[3].pos = *(ImVec2 *)((long)pfVar5 + lVar18 + local_40 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar2;
          pIVar3 = this->_VtxWritePtr;
          pIVar3[3].col = (ImU32)local_34;
          this->_VtxWritePtr = pIVar3 + 4;
          lVar18 = lVar18 + 0x20;
        } while (uVar19 * 0x20 != lVar18);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)IStack_70.y._0_2_;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}